

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true> *this,
          CompUnitEntry *Elt)

{
  uint64_t *puVar1;
  uint uVar2;
  uint64_t uVar3;
  
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
      super_SmallVectorBase.Size) {
    SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,true>::push_back(this);
  }
  uVar3 = Elt->Length;
  puVar1 = (uint64_t *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
                  super_SmallVectorBase.BeginX +
           (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
                  super_SmallVectorBase.Size * 0x10);
  *puVar1 = Elt->Offset;
  puVar1[1] = uVar3;
  uVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
          super_SmallVectorBase.Size;
  if (uVar2 < (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
    super_SmallVectorBase.Size = uVar2 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }